

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

void __thiscall Security::InsertNOPs(Security *this)

{
  int iVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Instr *local_20;
  Instr *instr;
  int count;
  Security *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InsertNOPsPhase,sourceContextId,functionId);
  if (((!bVar2) &&
      (bVar2 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag), !bVar2)) {
    local_20 = this->func->m_headInstr;
    while( true ) {
      instr._4_4_ = GetNextNOPInsertPoint(this);
      while( true ) {
        iVar1 = instr._4_4_;
        if (local_20 != (Instr *)0x0) {
          instr._4_4_ = instr._4_4_ + -1;
        }
        if (local_20 == (Instr *)0x0 || iVar1 == 0) break;
        local_20 = IR::Instr::GetNextRealInstr(local_20);
      }
      if (local_20 == (Instr *)0x0) break;
      InsertNOPBefore(this,local_20);
    }
  }
  return;
}

Assistant:

void
Security::InsertNOPs()
{
    if (PHASE_OFF(Js::InsertNOPsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }

    int count = 0;
    IR::Instr *instr = this->func->m_headInstr;

    while (true)
    {
        count = this->GetNextNOPInsertPoint();
        while (instr && count--)
        {
            instr = instr->GetNextRealInstr();
        }
        if (instr == nullptr)
        {
            break;
        }
        this->InsertNOPBefore(instr);
    };
}